

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileOptions::InternalSwap(FileOptions *this,FileOptions *other)

{
  InternalMetadataWithArena *this_00;
  FileOptions *other_local;
  FileOptions *this_local;
  Container *local_30;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
             &(other->uninterpreted_option_).super_RepeatedPtrFieldBase);
  std::swap<std::__cxx11::string*>(&(this->java_package_).ptr_,&(other->java_package_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->java_outer_classname_).ptr_,&(other->java_outer_classname_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->go_package_).ptr_,&(other->go_package_).ptr_);
  std::swap<std::__cxx11::string*>
            (&(this->objc_class_prefix_).ptr_,&(other->objc_class_prefix_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->csharp_namespace_).ptr_,&(other->csharp_namespace_).ptr_)
  ;
  std::swap<std::__cxx11::string*>(&(this->swift_prefix_).ptr_,&(other->swift_prefix_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->php_class_prefix_).ptr_,&(other->php_class_prefix_).ptr_)
  ;
  std::swap<bool>(&this->java_multiple_files_,&other->java_multiple_files_);
  std::swap<bool>(&this->java_generate_equals_and_hash_,&other->java_generate_equals_and_hash_);
  std::swap<bool>(&this->java_string_check_utf8_,&other->java_string_check_utf8_);
  std::swap<bool>(&this->cc_generic_services_,&other->cc_generic_services_);
  std::swap<bool>(&this->java_generic_services_,&other->java_generic_services_);
  std::swap<bool>(&this->py_generic_services_,&other->py_generic_services_);
  std::swap<bool>(&this->deprecated_,&other->deprecated_);
  std::swap<bool>(&this->cc_enable_arenas_,&other->cc_enable_arenas_);
  std::swap<int>(&this->optimize_for_,&other->optimize_for_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  this_00 = &other->_internal_metadata_;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) != 1) goto LAB_00ad7bfc;
  }
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  else {
    local_30 = (Container *)
               internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,&local_30->unknown_fields);
LAB_00ad7bfc:
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  return;
}

Assistant:

void FileOptions::InternalSwap(FileOptions* other) {
  uninterpreted_option_.InternalSwap(&other->uninterpreted_option_);
  java_package_.Swap(&other->java_package_);
  java_outer_classname_.Swap(&other->java_outer_classname_);
  go_package_.Swap(&other->go_package_);
  objc_class_prefix_.Swap(&other->objc_class_prefix_);
  csharp_namespace_.Swap(&other->csharp_namespace_);
  swift_prefix_.Swap(&other->swift_prefix_);
  php_class_prefix_.Swap(&other->php_class_prefix_);
  std::swap(java_multiple_files_, other->java_multiple_files_);
  std::swap(java_generate_equals_and_hash_, other->java_generate_equals_and_hash_);
  std::swap(java_string_check_utf8_, other->java_string_check_utf8_);
  std::swap(cc_generic_services_, other->cc_generic_services_);
  std::swap(java_generic_services_, other->java_generic_services_);
  std::swap(py_generic_services_, other->py_generic_services_);
  std::swap(deprecated_, other->deprecated_);
  std::swap(cc_enable_arenas_, other->cc_enable_arenas_);
  std::swap(optimize_for_, other->optimize_for_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
  _extensions_.Swap(&other->_extensions_);
}